

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O0

QString * toString(pchOption option)

{
  QString *this;
  int in_ESI;
  QString *in_RDI;
  undefined4 in_stack_00000018;
  
  this = (QString *)(ulong)(in_ESI + 1);
  switch(this) {
  case (QString *)0x0:
  case (QString *)0x3:
  default:
    QString::QString((QString *)0x244b32);
    break;
  case (QString *)0x1:
    QString::QString(this,(char *)CONCAT44(option,in_stack_00000018));
    break;
  case (QString *)0x2:
    QString::QString(this,(char *)CONCAT44(option,in_stack_00000018));
    break;
  case (QString *)0x4:
    QString::QString(this,(char *)CONCAT44(option,in_stack_00000018));
  }
  return in_RDI;
}

Assistant:

static inline QString toString(pchOption option)
{
    switch (option) {
    case pchUnset:
    case pchGenerateAuto:
        break;
    case pchNone:
         return "NotUsing";
    case pchCreateUsingSpecific:
        return "Create";
    case pchUseUsingSpecific:
        return "Use";
    }
    return QString();
}